

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

void __thiscall
helics::BrokerBase::loadInfoFromJson(BrokerBase *this,string *jsonString,bool runArgParser)

{
  element_type *this_00;
  size_type sVar1;
  element_type *this_01;
  byte in_DL;
  string *in_RSI;
  long *in_RDI;
  shared_ptr<helics::helicsCLI11App> sVar2;
  Error *clierror;
  ifstream file;
  istringstream jstringBroker;
  BrokerBase *in_stack_000004d8;
  istringstream jstringHelicsSub_1;
  istringstream jstringHelicsSub;
  istringstream jstringHelics;
  istringstream jstring;
  shared_ptr<helics::helicsCLI11App> sApp;
  shared_ptr<helics::helicsCLI11App> app;
  bool hasBrokerSection;
  bool hasHelicsBrokerSubSection;
  bool hasHelicsSubSection;
  bool hasHelicsSection;
  invalid_argument *iarg;
  json doc;
  App *in_stack_fffffffffffff2f8;
  App *in_stack_fffffffffffff300;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff308;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff310;
  char (*in_stack_fffffffffffff318) [7];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff320;
  element_type *in_stack_fffffffffffff330;
  allocator<char> *in_stack_fffffffffffff338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff340;
  char *in_stack_fffffffffffff348;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff350;
  reference in_stack_fffffffffffff398;
  undefined7 in_stack_fffffffffffff3a0;
  undefined1 in_stack_fffffffffffff3a7;
  allocator<char> local_c19 [49];
  undefined8 local_be8;
  undefined8 local_be0;
  allocator<char> local_bd1 [49];
  undefined8 local_ba0;
  undefined8 local_b98;
  allocator<char> local_b89 [49];
  undefined8 local_b58;
  undefined8 local_b50;
  allocator<char> local_b41 [49];
  undefined8 local_b10;
  undefined8 local_b08;
  long local_b00 [19];
  string *in_stack_fffffffffffff598;
  istringstream local_8f8 [391];
  allocator<char> local_771 [49];
  istringstream local_740 [391];
  allocator<char> local_5b9 [49];
  istringstream local_588 [391];
  allocator<char> local_401 [49];
  istringstream local_3d0 [391];
  allocator<char> local_249 [49];
  istringstream local_218 [400];
  undefined1 local_88 [36];
  byte local_64;
  bool local_63;
  byte local_62;
  byte local_61;
  byte local_11;
  string *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)in_stack_fffffffffffff300,in_stack_fffffffffffff2f8);
  fileops::loadJson(in_stack_fffffffffffff598);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=(in_stack_fffffffffffff310,in_stack_fffffffffffff308);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_fffffffffffff300);
  local_61 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::contains<const_char_(&)[7],_0>(in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  local_62 = 0;
  local_63 = false;
  if ((bool)local_61) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::operator[]<char_const>(in_stack_fffffffffffff350,in_stack_fffffffffffff348);
    in_stack_fffffffffffff3a7 =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
         ::contains<const_char_(&)[7],_0>(in_stack_fffffffffffff320,in_stack_fffffffffffff318);
    local_62 = in_stack_fffffffffffff3a7;
    in_stack_fffffffffffff398 =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>(in_stack_fffffffffffff350,in_stack_fffffffffffff348);
    local_63 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::contains<const_char_(&)[7],_0>(in_stack_fffffffffffff320,in_stack_fffffffffffff318)
    ;
  }
  local_64 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::contains<const_char_(&)[7],_0>(in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  if ((local_11 & 1) != 0) {
    sVar2 = generateBaseCLI(in_stack_000004d8);
    (**(code **)(*in_RDI + 0x40))
              (local_88,in_RDI,
               sVar2.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._M_pi);
    CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x504e14);
    std::shared_ptr<CLI::App>::shared_ptr<helics::helicsCLI11App,void>
              ((shared_ptr<CLI::App> *)in_stack_fffffffffffff300,
               (shared_ptr<helics::helicsCLI11App> *)in_stack_fffffffffffff2f8);
    CLI::App::add_subcommand
              ((App *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0),
               (App_p *)in_stack_fffffffffffff398);
    CLI::std::shared_ptr<CLI::App>::~shared_ptr((shared_ptr<CLI::App> *)0x504e5d);
    this_00 = CLI::std::
              __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x504e6a);
    CLI::App::allow_extras(&this_00->super_App,true);
    sVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find(in_stack_fffffffffffff340,(char)((ulong)in_stack_fffffffffffff338 >> 0x38),
                 (size_type)in_stack_fffffffffffff330);
    if (sVar1 == 0xffffffffffffffff) {
      std::ifstream::ifstream(local_b00,local_10,_S_in);
      CLI::std::
      __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x505561);
      CLI::App::parse_from_stream(in_stack_fffffffffffff300,(istream *)in_stack_fffffffffffff2f8);
      if ((local_61 & 1) != 0) {
        std::ios::clear((int)local_b00 + (int)*(undefined8 *)(local_b00[0] + -0x18));
        CLI::std::fpos<__mbstate_t>::fpos
                  ((fpos<__mbstate_t> *)in_stack_fffffffffffff300,
                   (streamoff)in_stack_fffffffffffff2f8);
        std::istream::seekg(local_b00,local_b10,local_b08);
        CLI::std::
        __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x5055dd);
        CLI::App::get_config_formatter_base(in_stack_fffffffffffff2f8);
        in_stack_fffffffffffff330 =
             CLI::std::
             __shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x5055fc);
        in_stack_fffffffffffff338 = local_b41;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338,
                   (allocator<char> *)in_stack_fffffffffffff330);
        CLI::ConfigBase::section
                  ((ConfigBase *)in_stack_fffffffffffff300,(string *)in_stack_fffffffffffff2f8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff300);
        std::allocator<char>::~allocator(local_b41);
        CLI::std::shared_ptr<CLI::ConfigBase>::~shared_ptr((shared_ptr<CLI::ConfigBase> *)0x505669);
        CLI::std::
        __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x505676);
        CLI::App::parse_from_stream(in_stack_fffffffffffff300,(istream *)in_stack_fffffffffffff2f8);
        if ((local_62 & 1) != 0) {
          std::ios::clear((int)local_b00 + (int)*(undefined8 *)(local_b00[0] + -0x18));
          CLI::std::fpos<__mbstate_t>::fpos
                    ((fpos<__mbstate_t> *)in_stack_fffffffffffff300,
                     (streamoff)in_stack_fffffffffffff2f8);
          std::istream::seekg(local_b00,local_b58,local_b50);
          CLI::std::
          __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x5056f2);
          CLI::App::get_config_formatter_base(in_stack_fffffffffffff2f8);
          CLI::std::__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x505711);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338,
                     (allocator<char> *)in_stack_fffffffffffff330);
          CLI::ConfigBase::section
                    ((ConfigBase *)in_stack_fffffffffffff300,(string *)in_stack_fffffffffffff2f8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff300);
          std::allocator<char>::~allocator(local_b89);
          CLI::std::shared_ptr<CLI::ConfigBase>::~shared_ptr
                    ((shared_ptr<CLI::ConfigBase> *)0x50577e);
          CLI::std::
          __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x50578b);
          CLI::App::parse_from_stream
                    (in_stack_fffffffffffff300,(istream *)in_stack_fffffffffffff2f8);
        }
        if ((local_63 & 1U) != 0) {
          std::ios::clear((int)local_b00 + (int)*(undefined8 *)(local_b00[0] + -0x18));
          CLI::std::fpos<__mbstate_t>::fpos
                    ((fpos<__mbstate_t> *)in_stack_fffffffffffff300,
                     (streamoff)in_stack_fffffffffffff2f8);
          std::istream::seekg(local_b00,local_ba0,local_b98);
          CLI::std::
          __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x5058d1);
          CLI::App::get_config_formatter_base(in_stack_fffffffffffff2f8);
          CLI::std::__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x5058f0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338,
                     (allocator<char> *)in_stack_fffffffffffff330);
          CLI::ConfigBase::section
                    ((ConfigBase *)in_stack_fffffffffffff300,(string *)in_stack_fffffffffffff2f8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff300);
          std::allocator<char>::~allocator(local_bd1);
          CLI::std::shared_ptr<CLI::ConfigBase>::~shared_ptr
                    ((shared_ptr<CLI::ConfigBase> *)0x50595d);
          CLI::std::
          __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x50596a);
          CLI::App::parse_from_stream
                    (in_stack_fffffffffffff300,(istream *)in_stack_fffffffffffff2f8);
        }
      }
      if ((local_64 & 1) != 0) {
        std::ios::clear((int)local_b00 + (int)*(undefined8 *)(local_b00[0] + -0x18));
        CLI::std::fpos<__mbstate_t>::fpos
                  ((fpos<__mbstate_t> *)in_stack_fffffffffffff300,
                   (streamoff)in_stack_fffffffffffff2f8);
        std::istream::seekg(local_b00,local_be8,local_be0);
        CLI::std::
        __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x505a40);
        CLI::App::get_config_formatter_base(in_stack_fffffffffffff2f8);
        in_stack_fffffffffffff300 =
             (App *)CLI::std::
                    __shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x505a5f);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338,
                   (allocator<char> *)in_stack_fffffffffffff330);
        CLI::ConfigBase::section
                  ((ConfigBase *)in_stack_fffffffffffff300,(string *)in_stack_fffffffffffff2f8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff300);
        std::allocator<char>::~allocator(local_c19);
        CLI::std::shared_ptr<CLI::ConfigBase>::~shared_ptr((shared_ptr<CLI::ConfigBase> *)0x505acc);
        CLI::std::
        __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x505ad9);
        CLI::App::parse_from_stream(in_stack_fffffffffffff300,(istream *)in_stack_fffffffffffff2f8);
      }
      std::ifstream::~ifstream(local_b00);
    }
    else {
      std::__cxx11::istringstream::istringstream(local_218,local_10,_S_in);
      CLI::std::
      __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x504ec2);
      CLI::App::parse_from_stream(in_stack_fffffffffffff300,(istream *)in_stack_fffffffffffff2f8);
      if ((local_61 & 1) != 0) {
        CLI::std::
        __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x504eef);
        CLI::App::get_config_formatter_base(in_stack_fffffffffffff2f8);
        CLI::std::__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )0x504f0e);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338,
                   (allocator<char> *)in_stack_fffffffffffff330);
        CLI::ConfigBase::section
                  ((ConfigBase *)in_stack_fffffffffffff300,(string *)in_stack_fffffffffffff2f8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff300);
        std::allocator<char>::~allocator(local_249);
        CLI::std::shared_ptr<CLI::ConfigBase>::~shared_ptr((shared_ptr<CLI::ConfigBase> *)0x504f81);
        std::__cxx11::istringstream::istringstream(local_3d0,local_10,_S_in);
        CLI::std::
        __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x504faa);
        CLI::App::parse_from_stream(in_stack_fffffffffffff300,(istream *)in_stack_fffffffffffff2f8);
        if ((local_62 & 1) != 0) {
          CLI::std::
          __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x504fd7);
          CLI::App::get_config_formatter_base(in_stack_fffffffffffff2f8);
          CLI::std::__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x504ff6);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338,
                     (allocator<char> *)in_stack_fffffffffffff330);
          CLI::ConfigBase::section
                    ((ConfigBase *)in_stack_fffffffffffff300,(string *)in_stack_fffffffffffff2f8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff300);
          std::allocator<char>::~allocator(local_401);
          CLI::std::shared_ptr<CLI::ConfigBase>::~shared_ptr
                    ((shared_ptr<CLI::ConfigBase> *)0x505063);
          std::__cxx11::istringstream::istringstream(local_588,local_10,_S_in);
          CLI::std::
          __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x50508c);
          CLI::App::parse_from_stream
                    (in_stack_fffffffffffff300,(istream *)in_stack_fffffffffffff2f8);
          std::__cxx11::istringstream::~istringstream(local_588);
        }
        if ((local_63 & 1U) != 0) {
          CLI::std::
          __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x505240);
          CLI::App::get_config_formatter_base(in_stack_fffffffffffff2f8);
          CLI::std::__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x50525f);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338,
                     (allocator<char> *)in_stack_fffffffffffff330);
          CLI::ConfigBase::section
                    ((ConfigBase *)in_stack_fffffffffffff300,(string *)in_stack_fffffffffffff2f8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff300);
          std::allocator<char>::~allocator(local_5b9);
          CLI::std::shared_ptr<CLI::ConfigBase>::~shared_ptr
                    ((shared_ptr<CLI::ConfigBase> *)0x5052cc);
          std::__cxx11::istringstream::istringstream(local_740,local_10,_S_in);
          CLI::std::
          __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x5052f5);
          CLI::App::parse_from_stream
                    (in_stack_fffffffffffff300,(istream *)in_stack_fffffffffffff2f8);
          std::__cxx11::istringstream::~istringstream(local_740);
        }
        std::__cxx11::istringstream::~istringstream(local_3d0);
      }
      if ((local_64 & 1) != 0) {
        CLI::std::
        __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x5053c8);
        CLI::App::get_config_formatter_base(in_stack_fffffffffffff2f8);
        this_01 = CLI::std::
                  __shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x5053e7);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                   (char *)in_stack_fffffffffffff338,(allocator<char> *)in_stack_fffffffffffff330);
        CLI::ConfigBase::section
                  ((ConfigBase *)in_stack_fffffffffffff300,(string *)in_stack_fffffffffffff2f8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff300);
        std::allocator<char>::~allocator(local_771);
        CLI::std::shared_ptr<CLI::ConfigBase>::~shared_ptr((shared_ptr<CLI::ConfigBase> *)0x505454);
        std::__cxx11::istringstream::istringstream(local_8f8,local_10,_S_in);
        CLI::std::
        __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x50547d);
        CLI::App::parse_from_stream(in_stack_fffffffffffff300,(istream *)in_stack_fffffffffffff2f8);
        std::__cxx11::istringstream::~istringstream(local_8f8);
      }
      std::__cxx11::istringstream::~istringstream(local_218);
    }
    CLI::std::shared_ptr<helics::helicsCLI11App>::~shared_ptr
              ((shared_ptr<helics::helicsCLI11App> *)0x505c18);
    CLI::std::shared_ptr<helics::helicsCLI11App>::~shared_ptr
              ((shared_ptr<helics::helicsCLI11App> *)0x505c25);
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_fffffffffffff300);
  return;
}

Assistant:

void BrokerBase::loadInfoFromJson(const std::string& jsonString, bool runArgParser)
{
    nlohmann::json doc;
    try {
        doc = fileops::loadJson(jsonString);
    }
    catch (const std::invalid_argument& iarg) {
        throw(helics::InvalidParameter(iarg.what()));
    }
    const bool hasHelicsSection = doc.contains("helics");
    bool hasHelicsSubSection{false};
    bool hasHelicsBrokerSubSection{false};
    if (hasHelicsSection) {
        hasHelicsSubSection = doc["helics"].contains("helics");
        hasHelicsBrokerSubSection = doc["helics"].contains("broker");
    }
    const bool hasBrokerSection = doc.contains("broker");

    if (runArgParser) {
        auto app = generateBaseCLI();
        auto sApp = generateCLI();
        app->add_subcommand(sApp);
        app->allow_extras();
        try {
            if (jsonString.find('{') != std::string::npos) {
                std::istringstream jstring(jsonString);
                app->parse_from_stream(jstring);
                if (hasHelicsSection) {
                    app->get_config_formatter_base()->section("helics");
                    std::istringstream jstringHelics(jsonString);
                    app->parse_from_stream(jstringHelics);
                    if (hasHelicsSubSection) {
                        app->get_config_formatter_base()->section("helics.helics");
                        std::istringstream jstringHelicsSub(jsonString);
                        app->parse_from_stream(jstringHelicsSub);
                    }
                    if (hasHelicsBrokerSubSection) {
                        app->get_config_formatter_base()->section("helics.broker");
                        std::istringstream jstringHelicsSub(jsonString);
                        app->parse_from_stream(jstringHelicsSub);
                    }
                }
                if (hasBrokerSection) {
                    app->get_config_formatter_base()->section("broker");
                    std::istringstream jstringBroker(jsonString);
                    app->parse_from_stream(jstringBroker);
                }
            } else {
                std::ifstream file(jsonString);
                app->parse_from_stream(file);
                if (hasHelicsSection) {
                    file.clear();
                    file.seekg(0);
                    app->get_config_formatter_base()->section("helics");
                    app->parse_from_stream(file);
                    if (hasHelicsSubSection) {
                        file.clear();
                        file.seekg(0);
                        app->get_config_formatter_base()->section("helics.helics");
                        app->parse_from_stream(file);
                    }
                    if (hasHelicsBrokerSubSection) {
                        file.clear();
                        file.seekg(0);
                        app->get_config_formatter_base()->section("helics.broker");
                        app->parse_from_stream(file);
                    }
                }
                if (hasBrokerSection) {
                    file.clear();
                    file.seekg(0);
                    app->get_config_formatter_base()->section("broker");
                    app->parse_from_stream(file);
                }
            }
        }
        catch (const CLI::Error& clierror) {
            throw(InvalidIdentifier(clierror.what()));
        }
    }
}